

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueType.cpp
# Opt level: O0

ValueType ValueType::FromObject(RecyclableObject *recyclableObject)

{
  code *pcVar1;
  JavascriptArray *this;
  bool bVar2;
  ObjectType OVar3;
  ValueType VVar4;
  undefined4 *puVar5;
  INT_PTR IVar6;
  INT_PTR IVar7;
  DynamicObject *object;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_20;
  Bits local_1e;
  TypeId TStack_1c;
  bool isVirtual;
  ValueType valueType;
  Bits bits;
  TypeId typeId;
  RecyclableObject *recyclableObject_local;
  
  _valueType = (JavascriptArray *)recyclableObject;
  if (recyclableObject == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x543,"(recyclableObject)","recyclableObject");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  TStack_1c = Js::RecyclableObject::GetTypeId((RecyclableObject *)_valueType);
  if (TStack_1c < TypeIds_Limit) {
    local_1e = TypeIdToBits[TStack_1c];
    bVar2 = operator!(local_1e);
    if (!bVar2) {
      local_20.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)Verify(local_1e)
      ;
      bVar2 = IsLikelyOptimizedTypedArray((ValueType *)&local_20.field_0);
      if (!bVar2) {
        return (ValueType)local_20.field_0;
      }
      IVar6 = VirtualTableInfoBase::GetVirtualTable(_valueType);
      IVar7 = GetVirtualTypedArrayVtable(TStack_1c);
      if (IVar6 != IVar7) {
        return (ValueType)local_20.bits;
      }
      OVar3 = GetObjectType((ValueType *)&local_20.field_0);
      VVar4 = GetObject(VirtualTypedArrayPair[OVar3]);
      return (ValueType)VVar4.field_0.bits;
    }
  }
  bVar2 = Js::DynamicType::Is(TStack_1c);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x553,"(DynamicType::Is(typeId))","DynamicType::Is(typeId)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = Js::JavascriptArray::IsNonES5Array(TStack_1c);
  this = _valueType;
  if (bVar2) {
    recyclableObject_local._6_2_ =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         FromArray(Array,_valueType,TStack_1c);
  }
  else {
    bVar2 = VirtualTableInfo<Js::DynamicObject>::HasVirtualTable(_valueType);
    if ((bVar2) && (bVar2 = Js::DynamicObject::HasObjectArray((DynamicObject *)this), bVar2)) {
      recyclableObject_local._6_2_ =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           FromObjectWithArray((DynamicObject *)this);
    }
    else {
      recyclableObject_local._6_2_ =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           GetObject(Object);
    }
  }
  return (anon_union_2_4_ea848c7b_for_ValueType_13)
         (anon_union_2_4_ea848c7b_for_ValueType_13)recyclableObject_local._6_2_;
}

Assistant:

ValueType ValueType::FromObject(Js::RecyclableObject *const recyclableObject)
{
    using namespace Js;
    Assert(recyclableObject);
    const TypeId typeId = recyclableObject->GetTypeId();
    if (typeId < _countof(TypeIdToBits))
    {
        const Bits bits = TypeIdToBits[typeId];
        if (!!bits)
        {
            const ValueType valueType = Verify(bits);
            if (!valueType.IsLikelyOptimizedTypedArray())
                return valueType;
            bool isVirtual = (VirtualTableInfoBase::GetVirtualTable(recyclableObject) == ValueType::GetVirtualTypedArrayVtable(typeId));
            if (!isVirtual)
                return valueType;
            return GetObject(VirtualTypedArrayPair[static_cast<uint16>(valueType.GetObjectType())]);
        }
    }
    Assert(DynamicType::Is(typeId)); // all static type IDs have nonzero values in TypeIdToBits

    if(!JavascriptArray::IsNonES5Array(typeId))
    {
        // TODO: Once the issue with loop bodies and uninitialized interpreter local slots is fixed, use FromVar
        DynamicObject *const object = static_cast<DynamicObject *>(recyclableObject);
        if(!VirtualTableInfo<DynamicObject>::HasVirtualTable(object) || !object->HasObjectArray())
            return GetObject(ObjectType::Object);
        return FromObjectWithArray(object);
    }

    return FromArray(ObjectType::Array, static_cast<JavascriptArray *>(recyclableObject), typeId);
}